

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pockle.c
# Opt level: O1

void pockle_release(Pockle *pockle,size_t mark)

{
  ulong uVar1;
  PocklePrimeRecord *e;
  
  uVar1 = pockle->nlist;
  while (mark < uVar1) {
    pockle->nlist = uVar1 - 1;
    e = pockle->list[uVar1 - 1];
    del234(pockle->tree,e);
    mp_free(e->prime);
    if (e->witness != (mp_int *)0x0) {
      mp_free(e->witness);
    }
    safefree(e->factors);
    safefree(e);
    uVar1 = pockle->nlist;
  }
  return;
}

Assistant:

void pockle_release(Pockle *pockle, size_t mark)
{
    while (pockle->nlist > mark) {
        PocklePrimeRecord *pr = pockle->list[--pockle->nlist];
        del234(pockle->tree, pr);
        mp_free(pr->prime);
        if (pr->witness)
            mp_free(pr->witness);
        sfree(pr->factors);
        sfree(pr);
    }
}